

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-close-fd.c
# Opt level: O2

int run_test_close_fd(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b_1;
  int64_t eval_b_3;
  uv_os_fd_t fd [2];
  uv_buf_t local_2c8;
  uv_pipe_t pipe_handle;
  uv_fs_t req;
  
  local_2c8 = uv_buf_init("",1);
  iVar1 = uv_pipe(fd,0,0);
  req.data = (void *)(long)iVar1;
  pipe_handle.data = (void *)0x0;
  if (req.data == (void *)0x0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(puVar2,&pipe_handle,0);
    req.data = (void *)(long)iVar1;
    if (req.data == (void *)0x0) {
      iVar1 = uv_pipe_open(&pipe_handle,fd[0]);
      req.data = (void *)(long)iVar1;
      if (req.data == (void *)0x0) {
        fd[0] = -1;
        eval_b_1 = 1;
        iVar1 = uv_fs_write((uv_loop_t *)0x0,&req,fd[1],&local_2c8,1,-1,(uv_fs_cb)0x0);
        eval_b_3 = (int64_t)iVar1;
        if (eval_b_3 == 1) {
          eval_b_1 = 1;
          if (req.result == 1) {
            uv_fs_req_cleanup(&req);
            iVar1 = close(fd[1]);
            eval_b_1 = (int64_t)iVar1;
            eval_b_3 = 0;
            if ((void *)eval_b_1 == (void *)0x0) {
              fd[1] = -1;
              iVar1 = uv_read_start((uv_stream_t *)&pipe_handle,alloc_cb,read_cb);
              eval_b_1 = (int64_t)iVar1;
              eval_b_3 = 0;
              if ((void *)eval_b_1 == (void *)0x0) {
                puVar2 = uv_default_loop();
                iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                eval_b_1 = (int64_t)iVar1;
                eval_b_3 = 0;
                if ((void *)eval_b_1 == (void *)0x0) {
                  eval_b_1 = 1;
                  eval_b_3 = (int64_t)read_cb_called;
                  if (eval_b_3 == 1) {
                    iVar1 = uv_is_active((uv_handle_t *)&pipe_handle);
                    eval_b_1 = (int64_t)iVar1;
                    eval_b_3 = 0;
                    if ((void *)eval_b_1 == (void *)0x0) {
                      iVar1 = uv_read_start((uv_stream_t *)&pipe_handle,alloc_cb,read_cb);
                      eval_b_1 = (int64_t)iVar1;
                      eval_b_3 = 0;
                      if ((void *)eval_b_1 == (void *)0x0) {
                        puVar2 = uv_default_loop();
                        iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                        eval_b_1 = (int64_t)iVar1;
                        eval_b_3 = 0;
                        if ((void *)eval_b_1 == (void *)0x0) {
                          eval_b_1 = 2;
                          eval_b_3 = (int64_t)read_cb_called;
                          if (eval_b_3 == 2) {
                            eval_b_1 = 0;
                            iVar1 = uv_is_closing((uv_handle_t *)&pipe_handle);
                            if (iVar1 == 0) {
                              pcVar4 = "!=";
                              pcVar5 = "uv_is_closing((const uv_handle_t *) &pipe_handle)";
                              pcVar3 = "0";
                              uVar6 = 0x55;
                              eval_b_3 = 0;
                            }
                            else {
                              puVar2 = uv_default_loop();
                              uv_walk(puVar2,close_walk_cb,(void *)0x0);
                              uv_run(puVar2,UV_RUN_DEFAULT);
                              eval_b_1 = 0;
                              puVar2 = uv_default_loop();
                              iVar1 = uv_loop_close(puVar2);
                              eval_b_3 = (int64_t)iVar1;
                              if (eval_b_3 == 0) {
                                uv_library_shutdown();
                                return 0;
                              }
                              pcVar4 = "==";
                              pcVar5 = "uv_loop_close(uv_default_loop())";
                              pcVar3 = "0";
                              uVar6 = 0x57;
                            }
                          }
                          else {
                            pcVar4 = "==";
                            pcVar5 = "read_cb_called";
                            pcVar3 = "2";
                            uVar6 = 0x54;
                          }
                        }
                        else {
                          pcVar4 = "==";
                          pcVar5 = "0";
                          pcVar3 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                          uVar6 = 0x53;
                        }
                      }
                      else {
                        pcVar4 = "==";
                        pcVar5 = "0";
                        pcVar3 = "uv_read_start((uv_stream_t *) &pipe_handle, alloc_cb, read_cb)";
                        uVar6 = 0x52;
                      }
                    }
                    else {
                      pcVar4 = "==";
                      pcVar5 = "0";
                      pcVar3 = "uv_is_active((const uv_handle_t *) &pipe_handle)";
                      uVar6 = 0x51;
                    }
                  }
                  else {
                    pcVar4 = "==";
                    pcVar5 = "read_cb_called";
                    pcVar3 = "1";
                    uVar6 = 0x50;
                  }
                }
                else {
                  pcVar4 = "==";
                  pcVar5 = "0";
                  pcVar3 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                  uVar6 = 0x4f;
                }
              }
              else {
                pcVar4 = "==";
                pcVar5 = "0";
                pcVar3 = "uv_read_start((uv_stream_t *) &pipe_handle, alloc_cb, read_cb)";
                uVar6 = 0x4e;
              }
            }
            else {
              pcVar4 = "==";
              pcVar5 = "0";
              pcVar3 = "close(fd[1])";
              uVar6 = 0x4b;
            }
          }
          else {
            pcVar4 = "==";
            pcVar5 = "req.result";
            pcVar3 = "1";
            uVar6 = 0x45;
            eval_b_3 = req.result;
          }
        }
        else {
          pcVar4 = "==";
          pcVar5 = "uv_fs_write(((void*)0), &req, fd[1], bufs, 1, -1, ((void*)0))";
          pcVar3 = "1";
          uVar6 = 0x44;
        }
        goto LAB_001144e5;
      }
      pcVar3 = "uv_pipe_open(&pipe_handle, fd[0])";
      uVar6 = 0x3c;
    }
    else {
      pcVar3 = "uv_pipe_init(uv_default_loop(), &pipe_handle, 0)";
      uVar6 = 0x3b;
    }
  }
  else {
    pcVar3 = "uv_pipe(fd, 0, 0)";
    uVar6 = 0x3a;
  }
  eval_b_3 = 0;
  pcVar5 = "0";
  pcVar4 = "==";
  eval_b_1 = (int64_t)req.data;
LAB_001144e5:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-close-fd.c"
          ,uVar6,pcVar3,pcVar4,pcVar5,eval_b_1,pcVar4,eval_b_3);
  abort();
}

Assistant:

TEST_IMPL(close_fd) {
  uv_pipe_t pipe_handle;
  uv_fs_t req;
  uv_buf_t bufs[1];
  uv_os_fd_t fd[2];
  bufs[0] = uv_buf_init("", 1);

  ASSERT_OK(uv_pipe(fd, 0, 0));
  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pipe_handle, 0));
  ASSERT_OK(uv_pipe_open(&pipe_handle, fd[0]));
  /* uv_pipe_open() takes ownership of the file descriptor. */
#ifdef _WIN32
  fd[0] = INVALID_HANDLE_VALUE;
#else
  fd[0] = -1;
#endif

  ASSERT_EQ(1, uv_fs_write(NULL, &req, fd[1], bufs, 1, -1, NULL));
  ASSERT_EQ(1, req.result);
  uv_fs_req_cleanup(&req);
#ifdef _WIN32
  ASSERT_NE(0, CloseHandle(fd[1]));
  fd[1] = INVALID_HANDLE_VALUE;
#else
  ASSERT_OK(close(fd[1]));
  fd[1] = -1;
#endif
  ASSERT_OK(uv_read_start((uv_stream_t *) &pipe_handle, alloc_cb, read_cb));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(1, read_cb_called);
  ASSERT_OK(uv_is_active((const uv_handle_t *) &pipe_handle));
  ASSERT_OK(uv_read_start((uv_stream_t *) &pipe_handle, alloc_cb, read_cb));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(2, read_cb_called);
  ASSERT_NE(0, uv_is_closing((const uv_handle_t *) &pipe_handle));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}